

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

void handleURI(char *str,char *base,FILE *o)

{
  uint uVar1;
  long lVar2;
  long local_38;
  xmlChar *res;
  xmlURIPtr uri;
  int ret;
  FILE *o_local;
  char *base_local;
  char *str_local;
  
  local_38 = 0;
  lVar2 = xmlCreateURI();
  if (base == (char *)0x0) {
    uVar1 = xmlParseURIReference(lVar2,str);
    if (uVar1 == 0) {
      xmlNormalizeURIPath(*(undefined8 *)(lVar2 + 0x30));
      xmlPrintURI(o,lVar2);
      fprintf((FILE *)o,"\n");
    }
    else {
      fprintf((FILE *)o,"%s : error %d\n",str,(ulong)uVar1);
    }
  }
  else {
    local_38 = xmlBuildURI(str,base);
    if (local_38 == 0) {
      fprintf((FILE *)o,"::ERROR::\n");
    }
    else {
      fprintf((FILE *)o,"%s\n",local_38);
    }
  }
  if (local_38 != 0) {
    (*_xmlFree)(local_38);
  }
  xmlFreeURI(lVar2);
  return;
}

Assistant:

static void
handleURI(const char *str, const char *base, FILE *o) {
    int ret;
    xmlURIPtr uri;
    xmlChar *res = NULL;

    uri = xmlCreateURI();

    if (base == NULL) {
	ret = xmlParseURIReference(uri, str);
	if (ret != 0)
	    fprintf(o, "%s : error %d\n", str, ret);
	else {
	    xmlNormalizeURIPath(uri->path);
	    xmlPrintURI(o, uri);
	    fprintf(o, "\n");
	}
    } else {
	res = xmlBuildURI((xmlChar *)str, (xmlChar *) base);
	if (res != NULL) {
	    fprintf(o, "%s\n", (char *) res);
	}
	else
	    fprintf(o, "::ERROR::\n");
    }
    if (res != NULL)
	xmlFree(res);
    xmlFreeURI(uri);
}